

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O0

URI * __thiscall URI::operator=(URI *this,char *uri)

{
  char *uri_local;
  URI *this_local;
  
  clear(this);
  std::__cxx11::string::operator=((string *)&this->mFullString,uri);
  parseString(this);
  return this;
}

Assistant:

const URI &URI::operator=( const char *uri ) 
{
	clear();
	mFullString = uri;
	parseString();
	return *this;
}